

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

int HasAlpha8b_SSE2(uint8_t *src,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  int local_9c;
  int mask;
  __m128i bits;
  __m128i v;
  char cStack_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  int i;
  __m128i all_0xff;
  int length_local;
  uint8_t *src_local;
  
  for (local_9c = 0; local_9c + 0x10 <= length; local_9c = local_9c + 0x10) {
    uVar1 = *(undefined8 *)(src + local_9c);
    uVar2 = *(undefined8 *)(src + local_9c + 8);
    cStack_48 = (char)uVar1;
    cStack_47 = (char)((ulong)uVar1 >> 8);
    cStack_46 = (char)((ulong)uVar1 >> 0x10);
    cStack_45 = (char)((ulong)uVar1 >> 0x18);
    i._0_1_ = (char)((ulong)uVar1 >> 0x20);
    i._1_1_ = (char)((ulong)uVar1 >> 0x28);
    i._2_1_ = (char)((ulong)uVar1 >> 0x30);
    i._3_1_ = (char)((ulong)uVar1 >> 0x38);
    all_0xff[0]._0_1_ = (char)uVar2;
    all_0xff[0]._1_1_ = (char)((ulong)uVar2 >> 8);
    all_0xff[0]._2_1_ = (char)((ulong)uVar2 >> 0x10);
    all_0xff[0]._3_1_ = (char)((ulong)uVar2 >> 0x18);
    all_0xff[0]._4_1_ = (char)((ulong)uVar2 >> 0x20);
    all_0xff[0]._5_1_ = (char)((ulong)uVar2 >> 0x28);
    all_0xff[0]._6_1_ = (char)((ulong)uVar2 >> 0x30);
    all_0xff[0]._7_1_ = (char)((ulong)uVar2 >> 0x38);
    auVar4[1] = -(cStack_47 == -1);
    auVar4[0] = -(cStack_48 == -1);
    auVar4[2] = -(cStack_46 == -1);
    auVar4[3] = -(cStack_45 == -1);
    auVar4[4] = -((char)i == -1);
    auVar4[5] = -(i._1_1_ == -1);
    auVar4[6] = -(i._2_1_ == -1);
    auVar4[7] = -(i._3_1_ == -1);
    uVar3 = CONCAT17(-(all_0xff[0]._7_1_ == -1),
                     CONCAT16(-(all_0xff[0]._6_1_ == -1),
                              CONCAT15(-(all_0xff[0]._5_1_ == -1),
                                       CONCAT14(-(all_0xff[0]._4_1_ == -1),
                                                CONCAT13(-(all_0xff[0]._3_1_ == -1),
                                                         CONCAT12(-(all_0xff[0]._2_1_ == -1),
                                                                  CONCAT11(-(all_0xff[0]._1_1_ == -1
                                                                            ),-((char)all_0xff[0] ==
                                                                               -1))))))));
    auVar4._8_8_ = uVar3;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 | (ushort)((byte)(uVar3 >> 7) & 1) << 8
                 | (ushort)((byte)(uVar3 >> 0xf) & 1) << 9 |
                 (ushort)((byte)(uVar3 >> 0x17) & 1) << 10 |
                 (ushort)((byte)(uVar3 >> 0x1f) & 1) << 0xb |
                 (ushort)((byte)(uVar3 >> 0x27) & 1) << 0xc |
                 (ushort)((byte)(uVar3 >> 0x2f) & 1) << 0xd |
                 (ushort)((byte)(uVar3 >> 0x37) & 1) << 0xe |
                (ushort)((byte)-(all_0xff[0]._7_1_ == -1) >> 7) << 0xf) != 0xffff) {
      return 1;
    }
  }
  while( true ) {
    if (length <= local_9c) {
      return 0;
    }
    if (src[local_9c] != 0xff) break;
    local_9c = local_9c + 1;
  }
  return 1;
}

Assistant:

static int HasAlpha8b_SSE2(const uint8_t* src, int length) {
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  int i = 0;
  for (; i + 16 <= length; i += 16) {
    const __m128i v = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i bits = _mm_cmpeq_epi8(v, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i < length; ++i) if (src[i] != 0xff) return 1;
  return 0;
}